

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Crop_x86_avx512::forward(Crop_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  void *__ptr;
  Allocator *pAVar1;
  bool bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  int *piVar31;
  pointer pMVar32;
  Option *opt_00;
  int iVar33;
  long lVar34;
  ulong uVar35;
  sbyte sVar36;
  uint uVar37;
  ulong uVar38;
  int q_1;
  int *piVar39;
  undefined7 uVar40;
  int iVar41;
  int q;
  int z;
  long lVar42;
  int iVar43;
  uint uVar44;
  bool bVar45;
  int _outw;
  int _outh;
  int _woffset;
  uint local_14c;
  Mat m;
  int _outc;
  int _hoffset;
  int local_f8;
  int _outd;
  Option *local_f0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blob_shapes;
  int iStack_d0;
  Allocator *pAStack_c8;
  int iStack_c0;
  int iStack_bc;
  int iStack_b8;
  int iStack_b4;
  int local_b0;
  size_t local_a8;
  int _coffset;
  int local_8c;
  int local_88;
  int _doffset;
  Mat m_2;
  
  local_14c = bottom_blob->w;
  local_f8 = bottom_blob->h;
  local_88 = bottom_blob->d;
  iVar33 = bottom_blob->c;
  iVar41 = bottom_blob->dims;
  uVar35 = bottom_blob->elemsize;
  local_8c = bottom_blob->elempack;
  iVar43 = 1;
  m.dims = iVar43;
  m.c = iVar43;
  local_f0 = opt;
  if (((this->super_Crop).starts_expr._M_string_length == 0) ||
     ((this->super_Crop).ends_expr._M_string_length == 0)) {
    if (iVar41 - 1U < 4) {
      lVar34 = (long)(int)local_14c;
      switch(iVar41) {
      case 1:
        m.elemsize._0_4_ = 4;
        m.w = local_8c * local_14c;
        m.h = 1;
        m.d = 1;
        m.cstep = (size_t)m.w;
        m.elempack = iVar43;
        goto LAB_0024fd22;
      case 2:
        m.h = local_8c * local_f8;
        m.dims = 2;
        m.d = 1;
        m.c = 1;
        m.cstep = m.h * lVar34;
        goto LAB_0024fcf9;
      case 3:
        m.dims = 3;
        m.d = 1;
        lVar34 = local_f8 * lVar34;
        break;
      case 4:
        m.dims = 4;
        lVar34 = local_f8 * lVar34 * (long)local_88;
        m.d = local_88;
      }
      m.c = local_8c * iVar33;
      m.cstep = lVar34 + 3U & 0x3ffffffffffffffc;
      m.h = local_f8;
LAB_0024fcf9:
      m.elempack = 1;
      m.elemsize._0_4_ = 4;
      m.w = local_14c;
    }
    else {
      m.cstep = 0;
      m.elemsize._0_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
    }
LAB_0024fd22:
    m.elemsize._4_4_ = 0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.allocator = (Allocator *)0x0;
    m.data = (void *)0x0;
    piVar39 = &_doffset;
    Crop::resolve_crop_roi
              (&this->super_Crop,&m,&_woffset,&_hoffset,piVar39,&_coffset,&_outw,&_outh,&_outd,
               &_outc);
    piVar31 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar31 != (int *)0x0) {
      LOCK();
      *piVar31 = *piVar31 + -1;
      UNLOCK();
      if (*piVar31 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    goto LAB_0025000f;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&bottom_blob_shapes,1,(allocator_type *)&m);
  pMVar32 = bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  switch(bottom_blob->dims) {
  case 1:
    m.cstep = (long)bottom_blob->elempack * (long)bottom_blob->w;
    m.w = (int)m.cstep;
    m.h = 1;
    m.d = 1;
    goto LAB_0024fe5e;
  case 2:
    m.w = bottom_blob->w;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    lVar34 = (long)bottom_blob->elempack * (long)bottom_blob->h;
    m.dims = 2;
    m.h = (int)lVar34;
    m.d = 1;
    m.c = 1;
    m.cstep = lVar34 * m.w;
    break;
  case 3:
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    m.c = bottom_blob->elempack * bottom_blob->c;
    m.dims = 3;
    m.d = 1;
    lVar34 = (long)m.h * (long)m.w;
    goto LAB_0024fe4d;
  case 4:
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    m.c = bottom_blob->elempack * bottom_blob->c;
    m.d = bottom_blob->d;
    m.dims = 4;
    lVar34 = (long)m.h * (long)m.w * (long)m.d;
LAB_0024fe4d:
    m.cstep = lVar34 + 3U & 0x3ffffffffffffffc;
LAB_0024fe5e:
    m.elempack = 1;
    m.elemsize._0_4_ = 4;
    break;
  default:
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != &m) {
    piVar39 = (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->refcount;
    if (piVar39 != (int *)0x0) {
      LOCK();
      *piVar39 = *piVar39 + -1;
      UNLOCK();
      if (*piVar39 == 0) {
        if ((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          free((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start)->data);
        }
        else {
          (*(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    pMVar32->cstep = 0;
    pMVar32->data = (void *)0x0;
    pMVar32->refcount = (int *)0x0;
    *(undefined8 *)((long)&pMVar32->refcount + 4) = 0;
    *(undefined8 *)((long)&pMVar32->elemsize + 4) = 0;
    pMVar32->dims = 0;
    pMVar32->w = 0;
    pMVar32->h = 0;
    pMVar32->d = 0;
    pMVar32->c = 0;
    piVar39 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    pMVar32->data = m.data;
    pMVar32->refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    pMVar32->elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
    pMVar32->elempack = m.elempack;
    pMVar32->allocator = m.allocator;
    pMVar32->dims = m.dims;
    pMVar32->w = m.w;
    pMVar32->h = m.h;
    pMVar32->d = m.d;
    pMVar32->c = m.c;
    pMVar32->cstep = m.cstep;
    if (piVar39 != (int *)0x0) {
      LOCK();
      *piVar39 = *piVar39 + -1;
      UNLOCK();
      if (*piVar39 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar39 = &_doffset;
  Crop::eval_crop_expr
            (&this->super_Crop,&bottom_blob_shapes,&_woffset,&_hoffset,piVar39,&_coffset,&_outw,
             &_outh,&_outd,&_outc);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blob_shapes);
LAB_0025000f:
  opt_00 = local_f0;
  uVar40 = (undefined7)((ulong)piVar39 >> 8);
  if (local_8c == 4) {
    if (iVar41 - 1U < 4) {
      iVar43 = _outc >> 2;
      switch(iVar41) {
      case 1:
        uVar44 = _outw & 3;
        iVar33 = (uint)(uVar44 == 0) * 3 + 1;
        uVar38 = (long)_outw % (long)iVar33;
        if (local_14c == _outw / iVar33 && uVar44 == 0) {
          if (top_blob == bottom_blob) {
            return 0;
          }
          piVar39 = bottom_blob->refcount;
          if (piVar39 != (int *)0x0) {
            LOCK();
            *piVar39 = *piVar39 + 1;
            UNLOCK();
          }
          piVar39 = top_blob->refcount;
          if (piVar39 == (int *)0x0) goto LAB_00251211;
          LOCK();
          *piVar39 = *piVar39 + -1;
          UNLOCK();
          if (*piVar39 != 0) goto LAB_00251211;
          __ptr = top_blob->data;
          pAVar1 = top_blob->allocator;
joined_r0x0025019a:
          uVar38 = uVar38 & 0xffffffff;
          goto joined_r0x0025019a;
        }
        if (((_outw | _woffset) & 3U) == 0) {
          Mat::create(top_blob,_outw / iVar33,(uVar35 >> 2) << (uVar44 == 0) * '\x02',iVar33,
                      local_f0->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            crop_pack4_sse(bottom_blob,top_blob,0,_woffset / 4);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        if (_outw == local_14c) {
          iVar33 = (uint)((_outh & 3U) == 0) * 3 + 1;
          uVar38 = (long)_outh % (long)iVar33;
          if (((_outh & 3U) == 0) && (_outh / iVar33 == local_f8)) {
            if (top_blob == bottom_blob) {
              return 0;
            }
            piVar39 = bottom_blob->refcount;
            if (piVar39 != (int *)0x0) {
              LOCK();
              *piVar39 = *piVar39 + 1;
              UNLOCK();
            }
            piVar39 = top_blob->refcount;
            if (piVar39 == (int *)0x0) goto LAB_00251211;
            LOCK();
            *piVar39 = *piVar39 + -1;
            UNLOCK();
            if (*piVar39 != 0) goto LAB_00251211;
            __ptr = top_blob->data;
            pAVar1 = top_blob->allocator;
            goto joined_r0x0025019a;
          }
        }
        if (((_hoffset | _outh) & 3U) == 0) {
          Mat::create(top_blob,_outw,_outh >> 2,(uVar35 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                      local_f0->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            crop_pack4_sse(bottom_blob,top_blob,_hoffset / 4,_woffset);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar44 = _outc & 3;
        bVar45 = local_f8 == _outh;
        bVar2 = local_14c == _outw;
        if (bVar45 && bVar2) {
          iVar41 = (uint)((_outc & 3U) == 0) * 3 + 1;
          uVar38 = (long)_outc % (long)iVar41;
          if (((_outc & 3U) == 0) && (_outc / iVar41 == iVar33)) {
            if (top_blob == bottom_blob) {
              return 0;
            }
            piVar39 = bottom_blob->refcount;
            if (piVar39 != (int *)0x0) {
              LOCK();
              *piVar39 = *piVar39 + 1;
              UNLOCK();
            }
            piVar39 = top_blob->refcount;
            if (piVar39 == (int *)0x0) goto LAB_00251211;
            LOCK();
            *piVar39 = *piVar39 + -1;
            UNLOCK();
            if (*piVar39 != 0) goto LAB_00251211;
            __ptr = top_blob->data;
            pAVar1 = top_blob->allocator;
joined_r0x002503ba:
            uVar38 = uVar38 & 0xffffffff;
            goto joined_r0x0025019a;
          }
        }
        if (((_coffset | _outc) & 3U) == 0) {
          uVar38 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset >> 2) * bottom_blob->cstep * uVar38 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (undefined4)uVar38;
          m.elemsize._4_4_ = (undefined4)(uVar38 >> 0x20);
          uVar11 = bottom_blob->dims;
          uVar12 = bottom_blob->w;
          uVar13 = bottom_blob->h;
          uVar14 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar38 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar38;
          m.dims = uVar11;
          m.w = uVar12;
          m.h = uVar13;
          m.d = uVar14;
          m.c = iVar43;
          if (bVar45 && bVar2) {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_f0->blob_allocator,_outh,
                       (void *)CONCAT71(uVar40,bVar45 && bVar2));
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish)->data =
                     *(int *)&(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar39 = top_blob->refcount;
              if (piVar39 != (int *)0x0) {
                LOCK();
                *piVar39 = *piVar39 + -1;
                UNLOCK();
                if (*piVar39 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    free(top_blob->data);
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              top_blob->elemsize =
                   (size_t)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
              top_blob->elempack = iStack_d0;
              top_blob->allocator = pAStack_c8;
              top_blob->dims = iStack_c0;
              top_blob->w = iStack_bc;
              top_blob->h = iStack_b8;
              top_blob->d = iStack_b4;
              top_blob->c = local_b0;
              top_blob->cstep = local_a8;
            }
            if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + -1;
              UNLOCK();
              if (*(int *)&(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish)->data == 0) {
                if (pAStack_c8 == (Allocator *)0x0) {
                  free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start);
                }
                else {
                  (*pAStack_c8->_vptr_Allocator[3])();
                }
              }
            }
            iVar33 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_00251334;
          }
          else {
LAB_00251334:
            Mat::create(top_blob,_outw,_outh,_outc / 4,(uVar35 >> 2) << (uVar44 == 0) * '\x02',4,
                        opt_00->blob_allocator);
            iVar33 = -100;
            if ((top_blob->data != (void *)0x0) &&
               (uVar35 = (ulong)top_blob->c, top_blob->cstep * uVar35 != 0)) {
              iVar33 = 0;
              for (lVar34 = 0; lVar34 < (int)uVar35; lVar34 = lVar34 + 1) {
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage =
                     (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start =
                     (pointer)(m.cstep * lVar34 *
                               (long)bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage +
                              (long)m.data);
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish = (pointer)0x0;
                m_2.w = top_blob->w;
                m_2.h = top_blob->h;
                m_2.elemsize = top_blob->elemsize;
                m_2.data = (void *)(top_blob->cstep * lVar34 * m_2.elemsize + (long)top_blob->data);
                m_2.elempack = top_blob->elempack;
                m_2.allocator = top_blob->allocator;
                m_2.refcount = (int *)0x0;
                m_2.c = top_blob->d;
                m_2.d = 1;
                m_2.dims = top_blob->dims + -1;
                m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                            m_2.elemsize;
                if (top_blob->dims == 4) {
                  m_2.cstep = (long)m_2.h * (long)m_2.w;
                }
                crop_pack4_sse((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                uVar35 = (ulong)(uint)top_blob->c;
              }
            }
          }
          piVar39 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar39 == (int *)0x0) {
            return iVar33;
          }
          LOCK();
          *piVar39 = *piVar39 + -1;
          UNLOCK();
          if (*piVar39 != 0) {
            return iVar33;
          }
          if (m.allocator != (Allocator *)0x0) {
            (*(m.allocator)->_vptr_Allocator[3])();
            return iVar33;
          }
          goto LAB_002511d3;
        }
        break;
      case 4:
        uVar44 = _outc & 3;
        if (local_88 == _outd && (local_f8 == _outh && local_14c == _outw)) {
          iVar41 = (uint)((_outc & 3U) == 0) * 3 + 1;
          uVar38 = (long)_outc % (long)iVar41;
          if (((_outc & 3U) == 0) && (_outc / iVar41 == iVar33)) {
            if (top_blob == bottom_blob) {
              return 0;
            }
            piVar39 = bottom_blob->refcount;
            if (piVar39 != (int *)0x0) {
              LOCK();
              *piVar39 = *piVar39 + 1;
              UNLOCK();
            }
            piVar39 = top_blob->refcount;
            if (piVar39 == (int *)0x0) goto LAB_00251211;
            LOCK();
            *piVar39 = *piVar39 + -1;
            UNLOCK();
            if (*piVar39 != 0) goto LAB_00251211;
            __ptr = top_blob->data;
            pAVar1 = top_blob->allocator;
            goto joined_r0x0025019a;
          }
        }
        if (((_coffset | _outc) & 3U) == 0) {
          uVar38 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset >> 2) * bottom_blob->cstep * uVar38 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (undefined4)uVar38;
          m.elemsize._4_4_ = (undefined4)(uVar38 >> 0x20);
          uVar15 = bottom_blob->dims;
          uVar16 = bottom_blob->w;
          uVar17 = bottom_blob->h;
          uVar18 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar38 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar38;
          m.dims = uVar15;
          m.w = uVar16;
          m.h = uVar17;
          m.d = uVar18;
          m.c = iVar43;
          if (local_88 != _outd || (local_f8 != _outh || local_14c != _outw)) {
LAB_002518c5:
            Mat::create(top_blob,_outw,_outh,_outd,_outc / 4,(uVar35 >> 2) << (uVar44 == 0) * '\x02'
                        ,4,opt_00->blob_allocator);
            iVar33 = -100;
            if ((top_blob->data != (void *)0x0) &&
               (uVar35 = (ulong)top_blob->c, top_blob->cstep * uVar35 != 0)) {
              for (lVar34 = 0; lVar34 < (int)uVar35; lVar34 = lVar34 + 1) {
                for (lVar42 = 0; lVar42 < _outd; lVar42 = lVar42 + 1) {
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)((long)m.data +
                                (long)(_doffset + (int)lVar42) *
                                (long)bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage *
                                (long)m.h * (long)m.w +
                                m.cstep * lVar34 *
                                (long)bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  m_2.dims = 2;
                  m_2.w = top_blob->w;
                  m_2.h = top_blob->h;
                  m_2.elemsize = top_blob->elemsize;
                  m_2.elempack = top_blob->elempack;
                  m_2.allocator = top_blob->allocator;
                  m_2.cstep = (long)m_2.h * (long)m_2.w;
                  m_2.data = (void *)((long)top_blob->data +
                                     lVar42 * m_2.elemsize * m_2.cstep +
                                     top_blob->cstep * lVar34 * m_2.elemsize);
                  m_2.refcount = (int *)0x0;
                  m_2.d = 1;
                  m_2.c = 1;
                  crop_pack4_sse((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                }
                uVar35 = (ulong)(uint)top_blob->c;
              }
              iVar33 = 0;
            }
          }
          else {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_f0->blob_allocator,_outd,
                       (void *)(ulong)(uint)_outh);
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish)->data =
                     *(int *)&(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar39 = top_blob->refcount;
              if (piVar39 != (int *)0x0) {
                LOCK();
                *piVar39 = *piVar39 + -1;
                UNLOCK();
                if (*piVar39 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    free(top_blob->data);
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              top_blob->elemsize =
                   (size_t)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
              top_blob->elempack = iStack_d0;
              top_blob->allocator = pAStack_c8;
              top_blob->dims = iStack_c0;
              top_blob->w = iStack_bc;
              top_blob->h = iStack_b8;
              top_blob->d = iStack_b4;
              top_blob->c = local_b0;
              top_blob->cstep = local_a8;
            }
            if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + -1;
              UNLOCK();
              if (*(int *)&(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish)->data == 0) {
                if (pAStack_c8 == (Allocator *)0x0) {
                  free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start);
                }
                else {
                  (*pAStack_c8->_vptr_Allocator[3])();
                }
              }
            }
            iVar33 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_002518c5;
          }
          piVar39 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar39 == (int *)0x0) {
            return iVar33;
          }
          LOCK();
          *piVar39 = *piVar39 + -1;
          UNLOCK();
          if (*piVar39 != 0) {
            return iVar33;
          }
          if (m.allocator != (Allocator *)0x0) {
            (*(m.allocator)->_vptr_Allocator[3])();
            return iVar33;
          }
          goto LAB_002511d3;
        }
      }
    }
    goto switchD_0025008c_default;
  }
  if (local_8c != 8) {
    if ((local_8c == 0x10) && (iVar41 - 1U < 4)) {
      switch(iVar41) {
      case 1:
        if ((_outw & 0xfU) == 0) {
          uVar44 = 0x10;
        }
        else if ((_outw & 7U) == 0) {
          uVar44 = 8;
        }
        else {
          uVar44 = (uint)((_outw & 3U) == 0) * 3 + 1;
        }
        uVar37 = uVar44 ^ 0x10 | local_14c ^ _outw / (int)uVar44;
        uVar38 = (ulong)uVar37;
        if (uVar37 == 0) {
          if (top_blob == bottom_blob) {
            return 0;
          }
          piVar39 = bottom_blob->refcount;
          if (piVar39 != (int *)0x0) {
            LOCK();
            *piVar39 = *piVar39 + 1;
            UNLOCK();
          }
          piVar39 = top_blob->refcount;
          if (piVar39 == (int *)0x0) goto LAB_00251211;
          LOCK();
          *piVar39 = *piVar39 + -1;
          UNLOCK();
          if (*piVar39 != 0) goto LAB_00251211;
          __ptr = top_blob->data;
          pAVar1 = top_blob->allocator;
          goto joined_r0x0025019a;
        }
        if ((uVar44 == 0x10) && ((_woffset & 0xfU) == 0)) {
          Mat::create(top_blob,_outw / (int)uVar44,uVar35 & 0xfffffffffffffff0,0x10,
                      local_f0->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            crop_pack16_avx512(bottom_blob,top_blob,0,_woffset / 0x10);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        if ((_outh & 0xfU) == 0) {
          iVar33 = 0x10;
        }
        else if ((_outh & 7U) == 0) {
          iVar33 = 8;
        }
        else {
          iVar33 = (uint)((_outh & 3U) == 0) * 3 + 1;
        }
        if (_outw == local_14c) {
          uVar38 = (long)_outh % (long)iVar33;
          if ((iVar33 == 0x10) && (_outh / iVar33 == local_f8)) {
            if (top_blob == bottom_blob) {
              return 0;
            }
            piVar39 = bottom_blob->refcount;
            if (piVar39 != (int *)0x0) {
              LOCK();
              *piVar39 = *piVar39 + 1;
              UNLOCK();
            }
            piVar39 = top_blob->refcount;
            if (piVar39 == (int *)0x0) goto LAB_00251211;
            LOCK();
            *piVar39 = *piVar39 + -1;
            UNLOCK();
            if (*piVar39 != 0) goto LAB_00251211;
            __ptr = top_blob->data;
            pAVar1 = top_blob->allocator;
            goto joined_r0x0025019a;
          }
        }
        if ((iVar33 == 0x10) && ((_hoffset & 0xfU) == 0)) {
          Mat::create(top_blob,_outw,_outh / 0x10,uVar35 & 0xfffffffffffffff0,0x10,
                      local_f0->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            crop_pack16_avx512(bottom_blob,top_blob,_hoffset / 0x10,_woffset);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        if ((_outc & 0xfU) == 0) {
          uVar44 = 0x10;
        }
        else if ((_outc & 7U) == 0) {
          uVar44 = 8;
        }
        else {
          uVar44 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        bVar45 = local_f8 == _outh;
        bVar2 = local_14c == _outw;
        if (bVar45 && bVar2) {
          uVar38 = (long)_outc % (long)(int)uVar44;
          if ((uVar44 == 0x10) && (_outc / (int)uVar44 == iVar33)) {
            if (top_blob == bottom_blob) {
              return 0;
            }
            piVar39 = bottom_blob->refcount;
            if (piVar39 != (int *)0x0) {
              LOCK();
              *piVar39 = *piVar39 + 1;
              UNLOCK();
            }
            piVar39 = top_blob->refcount;
            if (piVar39 == (int *)0x0) goto LAB_00251211;
            LOCK();
            *piVar39 = *piVar39 + -1;
            UNLOCK();
            if (*piVar39 != 0) goto LAB_00251211;
            __ptr = top_blob->data;
            pAVar1 = top_blob->allocator;
            goto joined_r0x002503ba;
          }
        }
        if (uVar44 == 0x10 && (_coffset & 0xfU) == 0) {
          iVar33 = _outc / 0x10;
          uVar38 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset >> 4) * bottom_blob->cstep * uVar38 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (undefined4)uVar38;
          m.elemsize._4_4_ = (undefined4)(uVar38 >> 0x20);
          uVar19 = bottom_blob->dims;
          uVar20 = bottom_blob->w;
          uVar21 = bottom_blob->h;
          uVar22 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar38 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar38;
          m.dims = uVar19;
          m.w = uVar20;
          m.h = uVar21;
          m.d = uVar22;
          m.c = iVar33;
          if (bVar45 && bVar2) {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_f0->blob_allocator,_outh,
                       (void *)CONCAT71(uVar40,bVar45 && bVar2));
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish)->data =
                     *(int *)&(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar39 = top_blob->refcount;
              if (piVar39 != (int *)0x0) {
                LOCK();
                *piVar39 = *piVar39 + -1;
                UNLOCK();
                if (*piVar39 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    free(top_blob->data);
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              top_blob->elemsize =
                   (size_t)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
              top_blob->elempack = iStack_d0;
              top_blob->allocator = pAStack_c8;
              top_blob->dims = iStack_c0;
              top_blob->w = iStack_bc;
              top_blob->h = iStack_b8;
              top_blob->d = iStack_b4;
              top_blob->c = local_b0;
              top_blob->cstep = local_a8;
            }
            if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + -1;
              UNLOCK();
              if (*(int *)&(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish)->data == 0) {
                if (pAStack_c8 == (Allocator *)0x0) {
                  free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start);
                }
                else {
                  (*pAStack_c8->_vptr_Allocator[3])();
                }
              }
            }
            iVar33 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              iVar33 = _outc / 0x10;
              goto LAB_002515fa;
            }
          }
          else {
LAB_002515fa:
            Mat::create(top_blob,_outw,_outh,iVar33,(ulong)uVar44 * (uVar35 >> 4),0x10,
                        local_f0->blob_allocator);
            iVar33 = -100;
            if ((top_blob->data != (void *)0x0) &&
               (uVar35 = (ulong)top_blob->c, top_blob->cstep * uVar35 != 0)) {
              iVar33 = 0;
              for (lVar34 = 0; lVar34 < (int)uVar35; lVar34 = lVar34 + 1) {
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage =
                     (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start =
                     (pointer)(m.cstep * lVar34 *
                               (long)bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage +
                              (long)m.data);
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish = (pointer)0x0;
                m_2.w = top_blob->w;
                m_2.h = top_blob->h;
                m_2.elemsize = top_blob->elemsize;
                m_2.data = (void *)(top_blob->cstep * lVar34 * m_2.elemsize + (long)top_blob->data);
                m_2.elempack = top_blob->elempack;
                m_2.allocator = top_blob->allocator;
                m_2.refcount = (int *)0x0;
                m_2.c = top_blob->d;
                m_2.d = 1;
                m_2.dims = top_blob->dims + -1;
                m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                            m_2.elemsize;
                if (top_blob->dims == 4) {
                  m_2.cstep = (long)m_2.h * (long)m_2.w;
                }
                crop_pack16_avx512((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                uVar35 = (ulong)(uint)top_blob->c;
              }
            }
          }
          piVar39 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar39 == (int *)0x0) {
            return iVar33;
          }
          LOCK();
          *piVar39 = *piVar39 + -1;
          UNLOCK();
          if (*piVar39 != 0) {
            return iVar33;
          }
          if (m.allocator != (Allocator *)0x0) {
            (*(m.allocator)->_vptr_Allocator[3])();
            return iVar33;
          }
          goto LAB_002511d3;
        }
        break;
      case 4:
        if ((_outc & 0xfU) == 0) {
          uVar44 = 0x10;
        }
        else if ((_outc & 7U) == 0) {
          uVar44 = 8;
        }
        else {
          uVar44 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        if (local_88 == _outd && (local_f8 == _outh && local_14c == _outw)) {
          uVar38 = (long)_outc % (long)(int)uVar44;
          if ((uVar44 == 0x10) && (_outc / (int)uVar44 == iVar33)) {
            if (top_blob == bottom_blob) {
              return 0;
            }
            piVar39 = bottom_blob->refcount;
            if (piVar39 != (int *)0x0) {
              LOCK();
              *piVar39 = *piVar39 + 1;
              UNLOCK();
            }
            piVar39 = top_blob->refcount;
            if (piVar39 == (int *)0x0) goto LAB_00251211;
            LOCK();
            *piVar39 = *piVar39 + -1;
            UNLOCK();
            if (*piVar39 != 0) goto LAB_00251211;
            __ptr = top_blob->data;
            pAVar1 = top_blob->allocator;
            goto joined_r0x0025019a;
          }
        }
        if (uVar44 == 0x10 && (_coffset & 0xfU) == 0) {
          iVar41 = _outc / 0x10;
          uVar38 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset >> 4) * bottom_blob->cstep * uVar38 +
                           (long)bottom_blob->data);
          iVar33 = -100;
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (undefined4)uVar38;
          m.elemsize._4_4_ = (undefined4)(uVar38 >> 0x20);
          uVar23 = bottom_blob->dims;
          uVar24 = bottom_blob->w;
          uVar25 = bottom_blob->h;
          uVar26 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar38 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar38;
          m.dims = uVar23;
          m.w = uVar24;
          m.h = uVar25;
          m.d = uVar26;
          m.c = iVar41;
          if (local_88 != _outd || (local_f8 != _outh || local_14c != _outw)) {
LAB_00251b74:
            Mat::create(top_blob,_outw,_outh,_outd,iVar41,(ulong)uVar44 * (uVar35 >> 4),0x10,
                        local_f0->blob_allocator);
            if ((top_blob->data != (void *)0x0) &&
               (uVar35 = (ulong)top_blob->c, top_blob->cstep * uVar35 != 0)) {
              for (lVar34 = 0; lVar34 < (int)uVar35; lVar34 = lVar34 + 1) {
                for (lVar42 = 0; lVar42 < _outd; lVar42 = lVar42 + 1) {
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)((long)m.data +
                                (long)(_doffset + (int)lVar42) *
                                (long)bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage *
                                (long)m.h * (long)m.w +
                                m.cstep * lVar34 *
                                (long)bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  m_2.dims = 2;
                  m_2.w = top_blob->w;
                  m_2.h = top_blob->h;
                  m_2.elemsize = top_blob->elemsize;
                  m_2.elempack = top_blob->elempack;
                  m_2.allocator = top_blob->allocator;
                  m_2.cstep = (long)m_2.h * (long)m_2.w;
                  m_2.data = (void *)((long)top_blob->data +
                                     lVar42 * m_2.elemsize * m_2.cstep +
                                     top_blob->cstep * lVar34 * m_2.elemsize);
                  m_2.refcount = (int *)0x0;
                  m_2.d = 1;
                  m_2.c = 1;
                  crop_pack16_avx512((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                }
                uVar35 = (ulong)(uint)top_blob->c;
              }
              iVar33 = 0;
            }
          }
          else {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_f0->blob_allocator,_outd,
                       (void *)(ulong)(uint)_outh);
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish)->data =
                     *(int *)&(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar39 = top_blob->refcount;
              if (piVar39 != (int *)0x0) {
                LOCK();
                *piVar39 = *piVar39 + -1;
                UNLOCK();
                if (*piVar39 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    free(top_blob->data);
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              top_blob->elemsize =
                   (size_t)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
              top_blob->elempack = iStack_d0;
              top_blob->allocator = pAStack_c8;
              top_blob->dims = iStack_c0;
              top_blob->w = iStack_bc;
              top_blob->h = iStack_b8;
              top_blob->d = iStack_b4;
              top_blob->c = local_b0;
              top_blob->cstep = local_a8;
            }
            if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + -1;
              UNLOCK();
              if (*(int *)&(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish)->data == 0) {
                if (pAStack_c8 == (Allocator *)0x0) {
                  free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start);
                }
                else {
                  (*pAStack_c8->_vptr_Allocator[3])();
                }
              }
            }
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              iVar41 = _outc / 0x10;
              goto LAB_00251b74;
            }
          }
          piVar39 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar39 == (int *)0x0) {
            return iVar33;
          }
          LOCK();
          *piVar39 = *piVar39 + -1;
          UNLOCK();
          if (*piVar39 != 0) {
            return iVar33;
          }
          if (m.allocator != (Allocator *)0x0) {
            (*(m.allocator)->_vptr_Allocator[3])();
            return iVar33;
          }
          goto LAB_002511d3;
        }
      }
    }
    goto switchD_0025008c_default;
  }
  switch(iVar41) {
  case 1:
    uVar44 = _outw & 7;
    bVar45 = (_outw & 3U) == 0;
    iVar33 = 8;
    if (uVar44 != 0) {
      iVar33 = (uint)bVar45 * 3 + 1;
    }
    sVar36 = bVar45 * '\x02';
    if (uVar44 == 0) {
      sVar36 = 3;
    }
    uVar38 = (long)_outw % (long)iVar33;
    if (local_14c == _outw / iVar33 && uVar44 == 0) {
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar39 = bottom_blob->refcount;
      if (piVar39 != (int *)0x0) {
        LOCK();
        *piVar39 = *piVar39 + 1;
        UNLOCK();
      }
      piVar39 = top_blob->refcount;
      if (piVar39 == (int *)0x0) goto LAB_00251211;
      LOCK();
      *piVar39 = *piVar39 + -1;
      UNLOCK();
      if (*piVar39 != 0) goto LAB_00251211;
      __ptr = top_blob->data;
      pAVar1 = top_blob->allocator;
joined_r0x00250250:
      uVar38 = uVar38 & 0xffffffff;
joined_r0x0025019a:
      if (pAVar1 == (Allocator *)0x0) {
        free(__ptr);
      }
      else {
        (*pAVar1->_vptr_Allocator[3])(pAVar1,__ptr,uVar38);
      }
LAB_00251211:
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar39 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar39;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar33 = bottom_blob->w;
      iVar41 = bottom_blob->h;
      iVar43 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar33;
      top_blob->h = iVar41;
      top_blob->d = iVar43;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    if (((_outw | _woffset) & 7U) == 0) {
      Mat::create(top_blob,_outw / iVar33,(uVar35 >> 3) << sVar36,8,local_f0->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep != 0) {
        crop_pack8_avx(bottom_blob,top_blob,0,_woffset / 8);
        return 0;
      }
      return -100;
    }
    break;
  case 2:
    sVar36 = ((_outh & 3U) == 0) * '\x02';
    if ((_outh & 7U) == 0) {
      sVar36 = 3;
    }
    if (_outw == local_14c) {
      iVar33 = 8;
      if ((_outh & 7U) != 0) {
        iVar33 = (uint)((_outh & 3U) == 0) * 3 + 1;
      }
      uVar38 = (long)_outh % (long)iVar33;
      if (((_outh & 7U) == 0) && (_outh / iVar33 == local_f8)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar39 = bottom_blob->refcount;
        if (piVar39 != (int *)0x0) {
          LOCK();
          *piVar39 = *piVar39 + 1;
          UNLOCK();
        }
        piVar39 = top_blob->refcount;
        if (piVar39 == (int *)0x0) goto LAB_00251211;
        LOCK();
        *piVar39 = *piVar39 + -1;
        UNLOCK();
        if (*piVar39 != 0) goto LAB_00251211;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x00250250;
      }
    }
    if (((_hoffset | _outh) & 7U) == 0) {
      Mat::create(top_blob,_outw,_outh / 8,(uVar35 >> 3) << sVar36,8,local_f0->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep != 0) {
        crop_pack8_avx(bottom_blob,top_blob,_hoffset / 8,_woffset);
        return 0;
      }
      return -100;
    }
    break;
  case 3:
    sVar36 = ((_outc & 3U) == 0) * '\x02';
    if ((_outc & 7U) == 0) {
      sVar36 = 3;
    }
    if (local_f8 == _outh && local_14c == _outw) {
      iVar41 = 8;
      if ((_outc & 7U) != 0) {
        iVar41 = (uint)((_outc & 3U) == 0) * 3 + 1;
      }
      uVar38 = (long)_outc % (long)iVar41;
      if (((_outc & 7U) == 0) && (_outc / iVar41 == iVar33)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar39 = bottom_blob->refcount;
        if (piVar39 != (int *)0x0) {
          LOCK();
          *piVar39 = *piVar39 + 1;
          UNLOCK();
        }
        piVar39 = top_blob->refcount;
        if (piVar39 == (int *)0x0) goto LAB_00251211;
        LOCK();
        *piVar39 = *piVar39 + -1;
        UNLOCK();
        if (*piVar39 != 0) goto LAB_00251211;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x00250250;
      }
    }
    if (((_coffset | _outc) & 7U) != 0) break;
    iVar33 = (int)((long)_outc / 8);
    uVar38 = bottom_blob->elemsize;
    m.data = (void *)((long)(_coffset / 8) * bottom_blob->cstep * uVar38 + (long)bottom_blob->data);
    m.elempack = bottom_blob->elempack;
    m.allocator = bottom_blob->allocator;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = (undefined4)uVar38;
    m.elemsize._4_4_ = (undefined4)(uVar38 >> 0x20);
    uVar3 = bottom_blob->dims;
    uVar4 = bottom_blob->w;
    uVar5 = bottom_blob->h;
    uVar6 = bottom_blob->d;
    m.cstep = ((long)bottom_blob->d * uVar38 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf &
              0xfffffffffffffff0) / uVar38;
    m.dims = uVar3;
    m.w = uVar4;
    m.h = uVar5;
    m.d = uVar6;
    m.c = iVar33;
    if (local_f8 != _outh || local_14c != _outw) {
LAB_00251e20:
      Mat::create(top_blob,_outw,_outh,iVar33,(uVar35 >> 3) << sVar36,8,opt_00->blob_allocator);
      iVar33 = -100;
      if ((top_blob->data != (void *)0x0) &&
         (uVar35 = (ulong)top_blob->c, top_blob->cstep * uVar35 != 0)) {
        iVar33 = 0;
        for (lVar34 = 0; lVar34 < (int)uVar35; lVar34 = lVar34 + 1) {
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(m.cstep * lVar34 *
                         (long)bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + (long)m.data);
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          m_2.w = top_blob->w;
          m_2.h = top_blob->h;
          m_2.elemsize = top_blob->elemsize;
          m_2.data = (void *)(top_blob->cstep * lVar34 * m_2.elemsize + (long)top_blob->data);
          m_2.elempack = top_blob->elempack;
          m_2.allocator = top_blob->allocator;
          m_2.refcount = (int *)0x0;
          m_2.c = top_blob->d;
          m_2.d = 1;
          m_2.dims = top_blob->dims + -1;
          m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                      m_2.elemsize;
          if (top_blob->dims == 4) {
            m_2.cstep = (long)m_2.h * (long)m_2.w;
          }
          crop_pack8_avx((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
          uVar35 = (ulong)(uint)top_blob->c;
        }
      }
    }
    else {
      Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_f0->blob_allocator,_outh,
                 (void *)((long)_outc / 8 & 0xffffffff));
      if ((Mat *)&bottom_blob_shapes != top_blob) {
        if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->data =
               *(int *)&(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish)->data + 1;
          UNLOCK();
        }
        piVar39 = top_blob->refcount;
        if (piVar39 != (int *)0x0) {
          LOCK();
          *piVar39 = *piVar39 + -1;
          UNLOCK();
          if (*piVar39 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data =
             bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
        top_blob->refcount =
             (int *)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        top_blob->elemsize =
             (size_t)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
        top_blob->elempack = iStack_d0;
        top_blob->allocator = pAStack_c8;
        top_blob->dims = iStack_c0;
        top_blob->w = iStack_bc;
        top_blob->h = iStack_b8;
        top_blob->d = iStack_b4;
        top_blob->c = local_b0;
        top_blob->cstep = local_a8;
      }
      if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        LOCK();
        *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->data =
             *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->data + -1;
        UNLOCK();
        if (*(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
          if (pAStack_c8 == (Allocator *)0x0) {
            free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start);
          }
          else {
            (*pAStack_c8->_vptr_Allocator[3])();
          }
        }
      }
      iVar33 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar33 = _outc / 8;
        goto LAB_00251e20;
      }
    }
    piVar39 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar39 == (int *)0x0) {
      return iVar33;
    }
    LOCK();
    *piVar39 = *piVar39 + -1;
    UNLOCK();
    if (*piVar39 != 0) {
      return iVar33;
    }
    if (m.allocator != (Allocator *)0x0) {
      (*(m.allocator)->_vptr_Allocator[3])();
      return iVar33;
    }
    goto LAB_002511d3;
  case 4:
    sVar36 = ((_outc & 3U) == 0) * '\x02';
    if ((_outc & 7U) == 0) {
      sVar36 = 3;
    }
    if (local_88 == _outd && (local_f8 == _outh && local_14c == _outw)) {
      iVar41 = 8;
      if ((_outc & 7U) != 0) {
        iVar41 = (uint)((_outc & 3U) == 0) * 3 + 1;
      }
      uVar38 = (long)_outc % (long)iVar41 & 0xffffffff;
      if (((_outc & 7U) == 0) && (_outc / iVar41 == iVar33)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar39 = bottom_blob->refcount;
        if (piVar39 != (int *)0x0) {
          LOCK();
          *piVar39 = *piVar39 + 1;
          UNLOCK();
        }
        piVar39 = top_blob->refcount;
        if (piVar39 == (int *)0x0) goto LAB_00251211;
        LOCK();
        *piVar39 = *piVar39 + -1;
        UNLOCK();
        if (*piVar39 != 0) goto LAB_00251211;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x0025019a;
      }
    }
    if (((_coffset | _outc) & 7U) == 0) {
      iVar33 = _outc / 8;
      uVar38 = bottom_blob->elemsize;
      m.data = (void *)((long)(_coffset / 8) * bottom_blob->cstep * uVar38 + (long)bottom_blob->data
                       );
      m.elempack = bottom_blob->elempack;
      m.allocator = bottom_blob->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar38;
      m.elemsize._4_4_ = (undefined4)(uVar38 >> 0x20);
      uVar7 = bottom_blob->dims;
      uVar8 = bottom_blob->w;
      uVar9 = bottom_blob->h;
      uVar10 = bottom_blob->d;
      m.cstep = ((long)bottom_blob->d * uVar38 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf &
                0xfffffffffffffff0) / uVar38;
      m.dims = uVar7;
      m.w = uVar8;
      m.h = uVar9;
      m.d = uVar10;
      m.c = iVar33;
      if (local_88 != _outd || (local_f8 != _outh || local_14c != _outw)) {
LAB_002520e6:
        Mat::create(top_blob,_outw,_outh,_outd,iVar33,(uVar35 >> 3) << sVar36,8,
                    opt_00->blob_allocator);
        iVar33 = -100;
        if ((top_blob->data != (void *)0x0) &&
           (uVar35 = (ulong)top_blob->c, top_blob->cstep * uVar35 != 0)) {
          for (lVar34 = 0; lVar34 < (int)uVar35; lVar34 = lVar34 + 1) {
            for (lVar42 = 0; lVar42 < _outd; lVar42 = lVar42 + 1) {
              bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
              bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((long)m.data +
                            (long)(_doffset + (int)lVar42) *
                            (long)bottom_blob_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage * (long)m.h * (long)m.w
                            + m.cstep * lVar34 *
                              (long)bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
              bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              m_2.dims = 2;
              m_2.w = top_blob->w;
              m_2.h = top_blob->h;
              m_2.elemsize = top_blob->elemsize;
              m_2.elempack = top_blob->elempack;
              m_2.allocator = top_blob->allocator;
              m_2.cstep = (long)m_2.h * (long)m_2.w;
              m_2.data = (void *)((long)top_blob->data +
                                 lVar42 * m_2.elemsize * m_2.cstep +
                                 top_blob->cstep * lVar34 * m_2.elemsize);
              m_2.refcount = (int *)0x0;
              m_2.d = 1;
              m_2.c = 1;
              crop_pack8_avx((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
            }
            uVar35 = (ulong)(uint)top_blob->c;
          }
          iVar33 = 0;
        }
      }
      else {
        Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_f0->blob_allocator,_outd,
                   (void *)(ulong)(uint)_outh);
        if ((Mat *)&bottom_blob_shapes != top_blob) {
          if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish)->data + 1;
            UNLOCK();
          }
          piVar39 = top_blob->refcount;
          if (piVar39 != (int *)0x0) {
            LOCK();
            *piVar39 = *piVar39 + -1;
            UNLOCK();
            if (*piVar39 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data =
               bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
          top_blob->refcount =
               (int *)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          top_blob->elemsize =
               (size_t)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
          top_blob->elempack = iStack_d0;
          top_blob->allocator = pAStack_c8;
          top_blob->dims = iStack_c0;
          top_blob->w = iStack_bc;
          top_blob->h = iStack_b8;
          top_blob->d = iStack_b4;
          top_blob->c = local_b0;
          top_blob->cstep = local_a8;
        }
        if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->data =
               *(int *)&(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish)->data + -1;
          UNLOCK();
          if (*(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data == 0) {
            if (pAStack_c8 == (Allocator *)0x0) {
              free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start);
            }
            else {
              (*pAStack_c8->_vptr_Allocator[3])();
            }
          }
        }
        iVar33 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          iVar33 = _outc / 8;
          goto LAB_002520e6;
        }
      }
      piVar39 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar39 == (int *)0x0) {
        return iVar33;
      }
      LOCK();
      *piVar39 = *piVar39 + -1;
      UNLOCK();
      if (*piVar39 != 0) {
        return iVar33;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar33;
      }
      goto LAB_002511d3;
    }
  }
switchD_0025008c_default:
  piVar39 = bottom_blob->refcount;
  m.data = bottom_blob->data;
  m.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  m.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  m.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  m.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  m.elempack = bottom_blob->elempack;
  m.allocator = bottom_blob->allocator;
  uVar27 = bottom_blob->dims;
  uVar28 = bottom_blob->w;
  uVar29 = bottom_blob->h;
  uVar30 = bottom_blob->d;
  m.c = bottom_blob->c;
  m.cstep = bottom_blob->cstep;
  if (piVar39 != (int *)0x0) {
    LOCK();
    *piVar39 = *piVar39 + 1;
    UNLOCK();
  }
  m.dims = uVar27;
  m.w = uVar28;
  m.h = uVar29;
  m.d = uVar30;
  if (local_8c == 1) {
LAB_00251188:
    iVar33 = Crop::forward(&this->super_Crop,&m,top_blob,opt_00);
  }
  else {
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)local_f0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_f0->workspace_allocator;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_f0->workspace_allocator;
    convert_packing(bottom_blob,&m,1,(Option *)&bottom_blob_shapes);
    if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) goto LAB_00251188;
    iVar33 = -100;
  }
  piVar39 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar39 != (int *)0x0) {
    LOCK();
    *piVar39 = *piVar39 + -1;
    UNLOCK();
    if (*piVar39 == 0) {
      if (m.allocator == (Allocator *)0x0) {
LAB_002511d3:
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar33;
}

Assistant:

int Crop_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    int _woffset, _hoffset, _doffset, _coffset;
    int _outw, _outh, _outd, _outc;
    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blob_shapes(1);
        bottom_blob_shapes[0] = bottom_blob.shape();
        eval_crop_expr(bottom_blob_shapes, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}